

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_sse4.c
# Opt level: O0

void aom_lowbd_blend_a64_d16_mask_sse4_1
               (uint8_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,
               int h,int subw,int subh,ConvolveParams *conv_params)

{
  CONV_BUF_TYPE *src1_00;
  uint32_t uVar1;
  uint32_t dst_stride_00;
  int iVar2;
  uint32_t in_ECX;
  CONV_BUF_TYPE *in_RDX;
  CONV_BUF_TYPE *unaff_RBX;
  __m128i *unaff_RBP;
  uint32_t in_ESI;
  CONV_BUF_TYPE *in_RDI;
  CONV_BUF_TYPE *in_R8;
  uint32_t in_R9D;
  uint8_t *unaff_R14;
  int unaff_retaddr;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000014;
  uint32_t in_stack_00000018;
  uint32_t in_stack_0000001c;
  int in_stack_00000020;
  undefined4 in_stack_00000024;
  int in_stack_00000028;
  uint32_t in_stack_0000002c;
  int in_stack_00000030;
  uint in_stack_00000034;
  int in_stack_00000038;
  uint32_t in_stack_0000003c;
  uint8_t *in_stack_00000040;
  __m128i v_round_offset;
  uint8_t *in_stack_00000060;
  uint32_t in_stack_00000068;
  int shift;
  int round_offset;
  int round_bits;
  int bd;
  undefined4 in_stack_00000088;
  uint32_t in_stack_00000098;
  int in_stack_000000a8;
  __m128i *in_stack_000000b0;
  int in_stack_000000b8;
  undefined4 in_stack_0000010c;
  undefined4 in_stack_00000114;
  uint8_t *in_stack_000001c0;
  uint32_t in_stack_000001c8;
  int in_stack_000001d0;
  int in_stack_000001d8;
  __m128i *in_stack_000001e0;
  int in_stack_000001e8;
  uint32_t in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  char cVar3;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  
  iVar2 = -(*(int *)(CONCAT44(in_stack_0000003c,in_stack_00000038) + 0x14) +
           *(int *)(CONCAT44(in_stack_0000003c,in_stack_00000038) + 0x18));
  uVar1 = iVar2 + 0xe;
  cVar3 = (char)uVar1;
  dst_stride_00 =
       (((1 << (cVar3 + 8U & 0x1f)) + (1 << (cVar3 + 7U & 0x1f))) - (1 << (cVar3 - 1U & 0x1f))) *
       0x40;
  iVar2 = iVar2 + 0x14;
  src1_00 = (CONV_BUF_TYPE *)CONCAT44(dst_stride_00,dst_stride_00);
  if ((in_stack_00000028 == 0) && (in_stack_00000030 == 0)) {
    if (in_stack_00000018 == 4) {
      aom_lowbd_blend_a64_d16_mask_subw0_subh0_w4_sse4_1
                ((uint8_t *)CONCAT44(in_R9D,8),uVar1,
                 (CONV_BUF_TYPE *)CONCAT44(iVar2,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff7c,src1_00,dst_stride_00,
                 (uint8_t *)CONCAT44(dst_stride_00,dst_stride_00),(uint32_t)unaff_RBX,(int)unaff_R14
                 ,unaff_RBP,unaff_retaddr);
    }
    else if (in_stack_00000018 == 8) {
      aom_lowbd_blend_a64_d16_mask_subw0_subh0_w8_sse4_1
                ((uint8_t *)CONCAT44(in_R9D,8),uVar1,
                 (CONV_BUF_TYPE *)CONCAT44(iVar2,in_stack_ffffffffffffff80),
                 in_stack_ffffffffffffff7c,src1_00,dst_stride_00,
                 (uint8_t *)CONCAT44(dst_stride_00,dst_stride_00),(uint32_t)unaff_RBX,(int)unaff_R14
                 ,unaff_RBP,unaff_retaddr);
    }
    else {
      lowbd_blend_a64_d16_mask_subw0_subh0_w16_sse4_1
                ((uint8_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffb0),
                 (uint32_t)((ulong)in_RDX >> 0x20),
                 (CONV_BUF_TYPE *)CONCAT44(in_ECX,in_stack_ffffffffffffffa0),
                 (uint32_t)((ulong)in_R8 >> 0x20),(CONV_BUF_TYPE *)CONCAT44(in_R9D,8),uVar1,
                 (uint8_t *)CONCAT44(in_stack_00000014,in_stack_00000010),in_stack_00000018,
                 in_stack_00000020,0,(__m128i *)((ulong)in_stack_00000034 << 0x20),in_stack_00000038
                );
    }
  }
  else if ((in_stack_00000028 == 1) && (in_stack_00000030 == 1)) {
    uVar1 = (uint32_t)((ulong)unaff_RBX >> 0x20);
    if (in_stack_00000018 == 4) {
      aom_lowbd_blend_a64_d16_mask_subw1_subh1_w4_sse4_1
                (unaff_R14,uVar1,(CONV_BUF_TYPE *)CONCAT44(dst_stride_00,dst_stride_00),
                 dst_stride_00,src1_00,dst_stride_00,mask,mask_stride,w,
                 (__m128i *)CONCAT44(in_stack_0000010c,h),subw);
    }
    else if (in_stack_00000018 == 8) {
      aom_lowbd_blend_a64_d16_mask_subw1_subh1_w8_sse4_1
                (unaff_R14,uVar1,(CONV_BUF_TYPE *)CONCAT44(dst_stride_00,dst_stride_00),
                 dst_stride_00,src1_00,dst_stride_00,mask,mask_stride,w,
                 (__m128i *)CONCAT44(in_stack_0000010c,h),subw);
    }
    else {
      lowbd_blend_a64_d16_mask_subw1_subh1_w16_sse4_1
                (in_stack_00000040,in_stack_0000003c,(CONV_BUF_TYPE *)CONCAT44(in_stack_00000034,1),
                 in_stack_0000002c,(CONV_BUF_TYPE *)CONCAT44(in_stack_00000024,in_stack_00000020),
                 in_stack_0000001c,in_stack_000001c0,in_stack_000001c8,in_stack_000001d0,
                 in_stack_000001d8,in_stack_000001e0,in_stack_000001e8);
    }
  }
  else if ((in_stack_00000028 == 1) && (in_stack_00000030 == 0)) {
    if (in_stack_00000018 == 4) {
      aom_lowbd_blend_a64_d16_mask_subw1_subh0_w4_sse4_1
                ((uint8_t *)in_RDI,in_ESI,in_RDX,in_ECX,in_R8,in_R9D,
                 (uint8_t *)CONCAT44(round_bits,round_offset),bd,(int)src1,
                 (__m128i *)CONCAT44(src0_stride,in_stack_00000088),(int)src0);
    }
    else if (in_stack_00000018 == 8) {
      aom_lowbd_blend_a64_d16_mask_subw1_subh0_w8_sse4_1
                ((uint8_t *)in_RDI,in_ESI,in_RDX,in_ECX,in_R8,in_R9D,
                 (uint8_t *)CONCAT44(round_bits,round_offset),bd,(int)src1,
                 (__m128i *)CONCAT44(src0_stride,in_stack_00000088),(int)src0);
    }
    else {
      lowbd_blend_a64_d16_mask_subw1_subh0_w16_sse4_1
                ((uint8_t *)unaff_RBP,(uint32_t)((ulong)unaff_R14 >> 0x20),unaff_RBX,dst_stride_00,
                 (CONV_BUF_TYPE *)CONCAT44(dst_stride_00,dst_stride_00),dst_stride_00,mask,
                 mask_stride,w,h,(__m128i *)CONCAT44(in_stack_00000114,subw),subh);
    }
  }
  else if (in_stack_00000018 == 4) {
    aom_lowbd_blend_a64_d16_mask_subw0_subh1_w4_sse4_1
              ((uint8_t *)in_RDI,in_ESI,in_RDX,in_ECX,in_R8,in_R9D,in_stack_00000060,
               in_stack_00000068,round_offset,(__m128i *)CONCAT44(src1_stride,bd),(int)src1);
  }
  else if (in_stack_00000018 == 8) {
    aom_lowbd_blend_a64_d16_mask_subw0_subh1_w8_sse4_1
              ((uint8_t *)in_RDI,in_ESI,in_RDX,in_ECX,in_R8,in_R9D,in_stack_00000060,
               in_stack_00000068,round_offset,(__m128i *)CONCAT44(src1_stride,bd),(int)src1);
  }
  else {
    lowbd_blend_a64_d16_mask_subw0_subh1_w16_sse4_1
              ((uint8_t *)CONCAT44(dst_stride_00,dst_stride_00),dst_stride_00,
               (CONV_BUF_TYPE *)CONCAT44(dst_stride_00,dst_stride_00),dst_stride_00,in_RDI,in_ESI,
               (uint8_t *)src0,in_stack_00000098,(int)dst,in_stack_000000a8,in_stack_000000b0,
               in_stack_000000b8);
  }
  return;
}

Assistant:

void aom_lowbd_blend_a64_d16_mask_sse4_1(
    uint8_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h, int subw, int subh,
    ConvolveParams *conv_params) {
  const int bd = 8;
  const int round_bits =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;

  const int round_offset =
      ((1 << (round_bits + bd)) + (1 << (round_bits + bd - 1)) -
       (1 << (round_bits - 1)))
      << AOM_BLEND_A64_ROUND_BITS;

  const int shift = round_bits + AOM_BLEND_A64_ROUND_BITS;
  assert(IMPLIES((void *)src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES((void *)src1 == dst, src1_stride == dst_stride));

  assert(h >= 4);
  assert(w >= 4);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  const __m128i v_round_offset = _mm_set1_epi32(round_offset);

  if (subw == 0 && subh == 0) {
    switch (w) {
      case 4:
        aom_lowbd_blend_a64_d16_mask_subw0_subh0_w4_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 8:
        aom_lowbd_blend_a64_d16_mask_subw0_subh0_w8_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      default:
        lowbd_blend_a64_d16_mask_subw0_subh0_w16_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &v_round_offset, shift);
        break;
    }

  } else if (subw == 1 && subh == 1) {
    switch (w) {
      case 4:
        aom_lowbd_blend_a64_d16_mask_subw1_subh1_w4_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 8:
        aom_lowbd_blend_a64_d16_mask_subw1_subh1_w8_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      default:
        lowbd_blend_a64_d16_mask_subw1_subh1_w16_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &v_round_offset, shift);
        break;
    }
  } else if (subw == 1 && subh == 0) {
    switch (w) {
      case 4:
        aom_lowbd_blend_a64_d16_mask_subw1_subh0_w4_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 8:
        aom_lowbd_blend_a64_d16_mask_subw1_subh0_w8_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      default:
        lowbd_blend_a64_d16_mask_subw1_subh0_w16_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &v_round_offset, shift);
        break;
    }
  } else {
    switch (w) {
      case 4:
        aom_lowbd_blend_a64_d16_mask_subw0_subh1_w4_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      case 8:
        aom_lowbd_blend_a64_d16_mask_subw0_subh1_w8_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, &v_round_offset, shift);
        break;
      default:
        lowbd_blend_a64_d16_mask_subw0_subh1_w16_sse4_1(
            dst, dst_stride, src0, src0_stride, src1, src1_stride, mask,
            mask_stride, h, w, &v_round_offset, shift);
        break;
    }
  }
}